

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int c14nCommonTest(char *filename,int with_comments,int mode,char *subdir)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  uint local_454;
  char *pcStack_450;
  int ret;
  char *ns;
  char *xpath;
  char *result;
  int len;
  char *base;
  char prefix [500];
  char local_228 [8];
  char buf [500];
  char *subdir_local;
  int mode_local;
  int with_comments_local;
  char *filename_local;
  
  ns = (char *)0x0;
  pcStack_450 = (char *)0x0;
  pcVar2 = baseFilename(filename);
  sVar3 = strlen(pcVar2);
  iVar1 = (int)sVar3 + -4;
  memcpy(&base,pcVar2,(long)iVar1);
  prefix[(long)iVar1 + -8] = '\0';
  iVar1 = snprintf(local_228,499,"result/c14n/%s/%s",subdir,&base);
  if (0x1f2 < iVar1) {
    buf[0x1eb] = '\0';
  }
  iVar1 = checkTestFile(local_228);
  if ((iVar1 == 0) && (update_results == 0)) {
    fprintf(_stderr,"Missing result file %s",local_228);
    filename_local._4_4_ = 0xffffffff;
  }
  else {
    pcVar2 = strdup(local_228);
    iVar1 = snprintf(local_228,499,"test/c14n/%s/%s.xpath",subdir,&base);
    if (0x1f2 < iVar1) {
      buf[0x1eb] = '\0';
    }
    iVar1 = checkTestFile(local_228);
    if (iVar1 != 0) {
      ns = strdup(local_228);
    }
    iVar1 = snprintf(local_228,499,"test/c14n/%s/%s.ns",subdir,&base);
    if (0x1f2 < iVar1) {
      buf[0x1eb] = '\0';
    }
    iVar1 = checkTestFile(local_228);
    if (iVar1 != 0) {
      pcStack_450 = strdup(local_228);
    }
    nb_tests = nb_tests + 1;
    iVar1 = c14nRunTest(filename,with_comments,mode,ns,pcStack_450,pcVar2);
    local_454 = (uint)(iVar1 < 0);
    if (pcVar2 != (char *)0x0) {
      free(pcVar2);
    }
    if (ns != (char *)0x0) {
      free(ns);
    }
    if (pcStack_450 != (char *)0x0) {
      free(pcStack_450);
    }
    filename_local._4_4_ = local_454;
  }
  return filename_local._4_4_;
}

Assistant:

static int
c14nCommonTest(const char *filename, int with_comments, int mode,
               const char *subdir) {
    char buf[500];
    char prefix[500];
    const char *base;
    int len;
    char *result = NULL;
    char *xpath = NULL;
    char *ns = NULL;
    int ret = 0;

    base = baseFilename(filename);
    len = strlen(base);
    len -= 4;
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(buf, 499, "result/c14n/%s/%s", subdir, prefix) >= 499)
        buf[499] = 0;
    if (!checkTestFile(buf) && !update_results) {
        fprintf(stderr, "Missing result file %s", buf);
	return(-1);
    }
    result = strdup(buf);
    if (snprintf(buf, 499, "test/c14n/%s/%s.xpath", subdir, prefix) >= 499)
        buf[499] = 0;
    if (checkTestFile(buf)) {
	xpath = strdup(buf);
    }
    if (snprintf(buf, 499, "test/c14n/%s/%s.ns", subdir, prefix) >= 499)
        buf[499] = 0;
    if (checkTestFile(buf)) {
	ns = strdup(buf);
    }

    nb_tests++;
    if (c14nRunTest(filename, with_comments, mode,
                    xpath, ns, result) < 0)
        ret = 1;

    if (result != NULL) free(result);
    if (xpath != NULL) free(xpath);
    if (ns != NULL) free(ns);
    return(ret);
}